

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O0

Status unpack(Header *header,FILE *ifp,FILE *ofp)

{
  Byte BVar1;
  Ferror FVar2;
  Word local_2c;
  Word len;
  FILE *ofp_local;
  FILE *ifp_local;
  Header *header_local;
  
  local_2c = header->complen;
  init_garble();
  crc = 0;
  putc_init();
  while ((local_2c != 0 && (FVar2 = check_stream(ifp), FVar2 == FNOERR))) {
    BVar1 = read_byte(ifp);
    BVar1 = ungarble(BVar1);
    putc_ncr(ofp,BVar1);
    local_2c = local_2c - 1;
  }
  FVar2 = check_stream(ifp);
  if (FVar2 == FRWERR) {
    header_local._4_4_ = RERR;
  }
  else if ((testing == '\0') && (FVar2 = check_stream(ofp), FVar2 == FRWERR)) {
    header_local._4_4_ = WERR;
  }
  else if ((crc & 0xffff) == (uint)header->crc) {
    if (testing == '\0') {
      msg("unpacked");
    }
    else {
      msg("OK (packed)");
    }
    header_local._4_4_ = NOERR;
  }
  else {
    header_local._4_4_ = CRCERR;
  }
  return header_local._4_4_;
}

Assistant:

Status
unpack(Header *header, FILE *ifp, FILE *ofp)
{
	register Word len = header->complen;

    init_garble();

	crc = 0;
	putc_init();
	while (len--)
	{
		if (check_stream(ifp) != FNOERR)
			break;
		putc_ncr(ofp, ungarble(read_byte(ifp)));
	}

	if (check_stream(ifp) == FRWERR)
		return (RERR);
	if (!testing && check_stream(ofp) == FRWERR)
		return (WERR);
	if ((Halfword) crc != header->crc)
		return (CRCERR);
	if (testing)
		msg("OK (packed)");
	else
		msg("unpacked");
	return (NOERR);
}